

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::TransformFeedback::CreationTest::iterate(CreationTest *this)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ContextInfo *this_00;
  TestContext *pTVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  undefined4 *puVar11;
  uint local_664;
  undefined1 local_660 [4];
  GLuint i_2;
  MessageBuilder local_4e0;
  int local_35c;
  undefined1 local_358 [4];
  GLint xfb_binding_point;
  uint local_1d4;
  undefined1 local_1d0 [4];
  GLuint i_1;
  uint local_50;
  GLuint i;
  int local_40 [2];
  GLuint xfb_legacy [2];
  GLuint xfb_dsa [2];
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  CreationTest *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    bVar1 = true;
    xfb_legacy[0] = 0;
    xfb_legacy[1] = 0;
    local_40[0] = 0;
    local_40[1] = 0;
    (**(code **)(lVar7 + 0xd0))(0x8e22,0);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBindTransformFeedback have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x65);
    (**(code **)(lVar7 + 0x700))(2,local_40);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGenTransformFeedbacks have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x69);
    for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
      cVar3 = (**(code **)(lVar7 + 0xcd0))(xfb_legacy[(ulong)local_50 - 2]);
      if (cVar3 != '\0') {
        bVar1 = false;
        pTVar8 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar9 = tcu::TestContext::getLog(pTVar8);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_1d0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1d0,
                             (char (*) [90])
                             "GenTransformFeedbacks has created defualt objects, but only shall reserve names for them."
                            );
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1d0);
      }
    }
    (**(code **)(lVar7 + 0x408))(2,xfb_legacy);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glCreateTransformFeedbacks have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x7b);
    for (local_1d4 = 0; local_1d4 < 2; local_1d4 = local_1d4 + 1) {
      cVar3 = (**(code **)(lVar7 + 0xcd0))(xfb_legacy[local_1d4]);
      if (cVar3 == '\0') {
        bVar1 = false;
        pTVar8 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar9 = tcu::TestContext::getLog(pTVar8);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_358,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_358,
                             (char (*) [58])
                             "CreateTransformFeedbacks has not created defualt objects.");
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_358);
      }
    }
    local_35c = -1;
    (**(code **)(lVar7 + 0x868))(0x8e25,&local_35c);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetIntegerv have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x8e);
    if (local_35c != 0) {
      if (local_35c == -1) {
        pTVar8 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar9 = tcu::TestContext::getLog(pTVar8);
        tcu::TestLog::operator<<(&local_4e0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (&local_4e0,
                             (char (*) [109])
                             "glGetIntegerv used with GL_TRANSFORM_FEEDBACK_BINDING have not returned anything and did not generate error."
                            );
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_4e0);
        puVar11 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar11 = 0;
        __cxa_throw(puVar11,&int::typeinfo,0);
      }
      pTVar8 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar9 = tcu::TestContext::getLog(pTVar8);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_660,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_660,
                           (char (*) [98])
                           "The usage of glCreateTransformFeedbacks have changed GL_TRANSFORM_FEEDBACK_BINDING binding point."
                          );
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_660);
      bVar1 = false;
    }
    for (local_664 = 0; local_664 < 2; local_664 = local_664 + 1) {
      if (xfb_legacy[(ulong)local_664 - 2] != 0) {
        (**(code **)(lVar7 + 0x488))(1);
        xfb_legacy[(ulong)local_664 - 2] = 0;
      }
      if (xfb_legacy[local_664] != 0) {
        (**(code **)(lVar7 + 0x488))(1);
        xfb_legacy[local_664] = 0;
      }
    }
    if (bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationTest::iterate()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Transform feedback objects */
	static const glw::GLuint xfb_count = 2;

	glw::GLuint xfb_dsa[xfb_count]	= {};
	glw::GLuint xfb_legacy[xfb_count] = {};

	try
	{
		/* Sanity default setup. */
		gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback have failed");

		/* Check legacy way. */
		gl.genTransformFeedbacks(xfb_count, xfb_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks have failed");

		for (glw::GLuint i = 0; i < xfb_count; ++i)
		{
			if (gl.isTransformFeedback(xfb_legacy[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GenTransformFeedbacks has created defualt objects, but only shall reserve names for them."
					<< tcu::TestLog::EndMessage;
			}
		}

		/* Check direct state access way. */
		gl.createTransformFeedbacks(xfb_count, xfb_dsa);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTransformFeedbacks have failed");

		for (glw::GLuint i = 0; i < xfb_count; ++i)
		{
			if (!gl.isTransformFeedback(xfb_dsa[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "CreateTransformFeedbacks has not created defualt objects."
													<< tcu::TestLog::EndMessage;
			}
		}

		/* Check binding point. */
		glw::GLint xfb_binding_point = -1;

		gl.getIntegerv(GL_TRANSFORM_FEEDBACK_BINDING, &xfb_binding_point);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv have failed");

		if (0 != xfb_binding_point)
		{
			if (-1 == xfb_binding_point)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "glGetIntegerv used with GL_TRANSFORM_FEEDBACK_BINDING have not "
													   "returned anything and did not generate error."
													<< tcu::TestLog::EndMessage;

				throw 0;
			}
			else
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "The usage of glCreateTransformFeedbacks have changed "
													   "GL_TRANSFORM_FEEDBACK_BINDING binding point."
													<< tcu::TestLog::EndMessage;

				is_ok = false;
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	for (glw::GLuint i = 0; i < xfb_count; ++i)
	{
		if (xfb_legacy[i])
		{
			gl.deleteTransformFeedbacks(1, &xfb_legacy[i]);

			xfb_legacy[i] = 0;
		}

		if (xfb_dsa[i])
		{
			gl.deleteTransformFeedbacks(1, &xfb_dsa[i]);

			xfb_dsa[i] = 0;
		}
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}